

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O1

lattice_site __thiscall sisl::cartesian_cubic<float>::get_dimensions(cartesian_cubic<float> *this)

{
  long lVar1;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  Index extraout_RDX;
  long in_RSI;
  lattice_site lVar2;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_40;
  Scalar local_20;
  Scalar local_1c;
  
  (this->super_base_lattice<float>)._vptr_base_lattice = (_func_int **)0x0;
  this->_nx = 0;
  this->_ny = 0;
  Eigen::DenseStorage<int,_-1,_-1,_1,_0>::resize((DenseStorage<int,__1,__1,_1,_0> *)this,3,3,1);
  local_40.m_row = 0;
  local_40.m_col = 1;
  local_40.m_currentBlockRows = 1;
  lVar1._0_4_ = this->_nx;
  lVar1._4_4_ = this->_ny;
  local_40.m_xpr = (Matrix<int,__1,_1,_0,__1,_1> *)this;
  if (lVar1 < 1) {
    __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                  "Eigen::CommaInitializer<Eigen::Matrix<int, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  *(undefined4 *)(this->super_base_lattice<float>)._vptr_base_lattice = *(undefined4 *)(in_RSI + 8);
  local_1c = *(Scalar *)(in_RSI + 0xc);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_40,&local_1c);
  local_20 = *(Scalar *)(in_RSI + 0x10);
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_(this_00,&local_20);
  if ((local_40.m_currentBlockRows + local_40.m_row == *(long *)((long)local_40.m_xpr + 8)) &&
     (local_40.m_col == 1)) {
    lVar2.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    lVar2.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this
    ;
    return (lattice_site)lVar2.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<int, -1, 1>>::finished() [MatrixType = Eigen::Matrix<int, -1, 1>]"
               );
}

Assistant:

virtual const lattice_site get_dimensions() const {
            lattice_site dims(3);
            dims << _nx, _ny, _nz;
            return dims;
        }